

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ABGRToAR30Row_C(uint8_t *src_abgr,uint8_t *dst_ar30,int width)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar1;
  }
  for (; (int)uVar2 != (int)uVar1; uVar1 = uVar1 + 1) {
    *(uint *)(dst_ar30 + uVar1 * 4) =
         (src_abgr[uVar1 * 4 + 3] & 0xffffffc0) << 0x18 |
         (src_abgr[uVar1 * 4] & 0xc0) << 0xe | (uint)src_abgr[uVar1 * 4] << 0x16 |
         (src_abgr[uVar1 * 4 + 1] & 0xc0) << 4 | (uint)src_abgr[uVar1 * 4 + 1] << 0xc |
         (uint)(src_abgr[uVar1 * 4 + 2] >> 6) + (uint)src_abgr[uVar1 * 4 + 2] * 4;
  }
  return;
}

Assistant:

void ABGRToAR30Row_C(const uint8_t* src_abgr, uint8_t* dst_ar30, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint32_t b0 = (src_abgr[0] >> 6) | ((uint32_t)(src_abgr[0]) << 2);
    uint32_t g0 = (src_abgr[1] >> 6) | ((uint32_t)(src_abgr[1]) << 2);
    uint32_t r0 = (src_abgr[2] >> 6) | ((uint32_t)(src_abgr[2]) << 2);
    uint32_t a0 = (src_abgr[3] >> 6);
    *(uint32_t*)(dst_ar30) = r0 | (g0 << 10) | (b0 << 20) | (a0 << 30);
    dst_ar30 += 4;
    src_abgr += 4;
  }
}